

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O0

ALchar * anon_unknown.dwarf_f6d9::NameFromUserFmtType(UserFmtType type)

{
  UserFmtType type_local;
  char *local_8;
  
  if (type == UserFmtUByte) {
    local_8 = "UInt8";
  }
  else if (type == UserFmtShort) {
    local_8 = "Int16";
  }
  else if (type == UserFmtFloat) {
    local_8 = "Float32";
  }
  else if (type == UserFmtDouble) {
    local_8 = "Float64";
  }
  else if (type == UserFmtMulaw) {
    local_8 = "muLaw";
  }
  else if (type == UserFmtAlaw) {
    local_8 = "aLaw";
  }
  else if (type == UserFmtIMA4) {
    local_8 = "IMA4 ADPCM";
  }
  else if (type == UserFmtMSADPCM) {
    local_8 = "MSADPCM";
  }
  else {
    local_8 = "<internal type error>";
  }
  return local_8;
}

Assistant:

const ALchar *NameFromUserFmtType(UserFmtType type)
{
    switch(type)
    {
    case UserFmtUByte: return "UInt8";
    case UserFmtShort: return "Int16";
    case UserFmtFloat: return "Float32";
    case UserFmtDouble: return "Float64";
    case UserFmtMulaw: return "muLaw";
    case UserFmtAlaw: return "aLaw";
    case UserFmtIMA4: return "IMA4 ADPCM";
    case UserFmtMSADPCM: return "MSADPCM";
    }
    return "<internal type error>";
}